

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O3

void __thiscall HEkkDual::minorChooseRow(HEkkDual *this)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  double *pdVar8;
  ulong uVar9;
  MChoice *pMVar10;
  double dVar11;
  
  this->multi_iChoice = -1;
  if ((long)this->multi_num < 1) {
    pMVar10 = (MChoice *)&this->row_out;
  }
  else {
    pdVar8 = &this->multi_choice[0].infeasEdWt;
    dVar11 = 0.0;
    uVar7 = 0xffffffff;
    uVar9 = 0;
    do {
      if ((-1 < ((MChoice *)(pdVar8 + -5))->row_out) &&
         (dVar1 = pdVar8[-1], dVar2 = *pdVar8, dVar11 < dVar1 / dVar2)) {
        this->multi_iChoice = (HighsInt)uVar9;
        uVar7 = uVar9 & 0xffffffff;
        dVar11 = dVar1 / dVar2;
      }
      uVar9 = uVar9 + 1;
      pdVar8 = pdVar8 + 0x49;
    } while ((long)this->multi_num != uVar9);
    this->row_out = -1;
    iVar6 = (int)uVar7;
    if (iVar6 == -1) {
      return;
    }
    pMVar10 = this->multi_choice + iVar6;
    iVar3 = pMVar10->row_out;
    this->row_out = iVar3;
    iVar4 = (this->ekk_instance_->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar3];
    this->variable_out = iVar4;
    dVar11 = this->multi_choice[iVar6].baseValue;
    dVar1 = this->multi_choice[iVar6].baseLower;
    uVar7 = -(ulong)(dVar11 < dVar1);
    dVar11 = dVar11 - (double)(~uVar7 & (ulong)this->multi_choice[iVar6].baseUpper |
                              (ulong)dVar1 & uVar7);
    this->delta_primal = dVar11;
    this->move_out = (uint)(0.0 <= dVar11) * 2 + -1;
    iVar5 = this->multi_nFinish;
    this->multi_finish[iVar5].row_out = iVar3;
    this->multi_finish[iVar5].variable_out = iVar4;
    this->multi_finish[iVar5].row_ep = &this->multi_choice[iVar6].row_ep;
    this->multi_finish[iVar5].col_aq = &this->multi_choice[iVar6].col_aq;
    this->multi_finish[iVar5].col_BFRT = &this->multi_choice[iVar6].col_BFRT;
    this->multi_finish[iVar5].EdWt = this->multi_choice[iVar6].infeasEdWt;
  }
  pMVar10->row_out = -1;
  return;
}

Assistant:

void HEkkDual::minorChooseRow() {
  /**
   * 1. Find which to go out
   *        Because we had other checking code
   *        We know current best is OK to be used
   */
  multi_iChoice = -1;
  double bestMerit = 0;
  for (HighsInt ich = 0; ich < multi_num; ich++) {
    const HighsInt iRow = multi_choice[ich].row_out;
    if (iRow < 0) continue;
    double infeasValue = multi_choice[ich].infeasValue;
    double infeasEdWt = multi_choice[ich].infeasEdWt;
    double infeasMerit = infeasValue / infeasEdWt;
    if (bestMerit < infeasMerit) {
      bestMerit = infeasMerit;
      multi_iChoice = ich;
    }
  }

  /**
   * 2. Obtain other info for current sub-optimization choice
   */
  row_out = kNoRowChosen;
  if (multi_iChoice != -1) {
    MChoice* workChoice = &multi_choice[multi_iChoice];

    // Assign useful variables
    row_out = workChoice->row_out;
    variable_out = ekk_instance_.basis_.basicIndex_[row_out];
    double valueOut = workChoice->baseValue;
    double lowerOut = workChoice->baseLower;
    double upperOut = workChoice->baseUpper;
    delta_primal = valueOut - (valueOut < lowerOut ? lowerOut : upperOut);
    move_out = delta_primal < 0 ? -1 : 1;

    // Assign buffers
    MFinish* finish = &multi_finish[multi_nFinish];
    finish->row_out = row_out;
    finish->variable_out = variable_out;
    finish->row_ep = &workChoice->row_ep;
    finish->col_aq = &workChoice->col_aq;
    finish->col_BFRT = &workChoice->col_BFRT;
    // Save the edge weight - over-written later when using Devex
    finish->EdWt = workChoice->infeasEdWt;

    // Disable current row
    workChoice->row_out = kNoRowChosen;
  }
}